

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall icu_63::number::impl::DecimalQuantity::_setToLong(DecimalQuantity *this,int64_t n)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  UErrorCode localStatus;
  DecNum decnum;
  
  if (0x7fffffff < n) {
    readLongToBcd(this,n);
    return;
  }
  if ((int)n == 0) {
    uVar4 = 0;
    iVar3 = 0x10;
  }
  else {
    iVar3 = 0x10;
    uVar4 = 0;
    do {
      iVar2 = (int)n;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar2;
      uVar4 = uVar4 >> 4 |
              (ulong)(iVar2 + (SUB164(auVar1 * ZEXT816(0xcccccccccccccccd),8) >> 2 & 0xfffffffe) *
                              -5) << 0x3c;
      n = (int64_t)(uint)(iVar2 / 10);
      iVar3 = iVar3 + -1;
    } while (0x12 < iVar2 + 9U);
  }
  (this->fBCD).bcdLong = uVar4 >> ((char)iVar3 * '\x04' & 0x3fU);
  this->scale = 0;
  this->precision = 0x10 - iVar3;
  return;
}

Assistant:

void DecimalQuantity::_setToLong(int64_t n) {
    if (n == INT64_MIN) {
        DecNum decnum;
        UErrorCode localStatus = U_ZERO_ERROR;
        decnum.setTo("9.223372036854775808E+18", localStatus);
        if (U_FAILURE(localStatus)) { return; } // unexpected
        flags |= NEGATIVE_FLAG;
        readDecNumberToBcd(decnum);
    } else if (n <= INT32_MAX) {
        readIntToBcd(static_cast<int32_t>(n));
    } else {
        readLongToBcd(n);
    }
}